

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

pair<std::_List_iterator<Item>,_bool> __thiscall State::insertClosure(State *this,Item *item)

{
  ItemList *pIVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  _List_iterator<Item> _Var4;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<std::_List_iterator<Item>,_bool> pVar8;
  
  pIVar1 = &this->closure;
  _Var4._M_node =
       (this->closure).super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
       super__List_node_base._M_next;
  if (_Var4._M_node != (_List_node_base *)pIVar1) {
    do {
      auVar6._0_4_ = -(uint)(*(int *)&_Var4._M_node[1]._M_next == *(int *)&(item->rule)._M_node);
      auVar6._4_4_ = -(uint)(*(int *)((long)&_Var4._M_node[1]._M_next + 4) ==
                            *(int *)((long)&(item->rule)._M_node + 4));
      auVar6._8_4_ = -(uint)(*(int *)&_Var4._M_node[1]._M_prev == *(int *)&(item->dot)._M_node);
      auVar6._12_4_ =
           -(uint)(*(int *)((long)&_Var4._M_node[1]._M_prev + 4) ==
                  *(int *)((long)&(item->dot)._M_node + 4));
      auVar7._4_4_ = auVar6._0_4_;
      auVar7._0_4_ = auVar6._4_4_;
      auVar7._8_4_ = auVar6._12_4_;
      auVar7._12_4_ = auVar6._8_4_;
      in_ECX = movmskpd(in_ECX,auVar7 & auVar6);
      if (in_ECX == 3) break;
      _Var4._M_node = (_Var4._M_node)->_M_next;
    } while (_Var4._M_node != (_List_node_base *)pIVar1);
  }
  if (_Var4._M_node == (_List_node_base *)pIVar1) {
    _Var4._M_node = (_List_node_base *)operator_new(0x20);
    p_Var3 = (item->dot)._M_node;
    _Var4._M_node[1]._M_next = (item->rule)._M_node;
    _Var4._M_node[1]._M_prev = p_Var3;
    std::__detail::_List_node_base::_M_hook(_Var4._M_node);
    psVar2 = &(this->closure).super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar5 = 0;
  }
  pVar8._8_8_ = uVar5;
  pVar8.first._M_node = _Var4._M_node;
  return pVar8;
}

Assistant:

std::pair<ItemPointer, bool> State::insertClosure(const Item &item)
{
  ItemPointer it = std::find (closure.begin (), closure.end (), item);

  if (it != closure.end ())
    return {it, false};

  return {closure.insert (it, item), true};
}